

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O2

void __thiscall LidarSensor::LidarSensor(LidarSensor *this,string *name,VectorXd *noise,int debug)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Sensor::Sensor(&this->super_Sensor,&local_40,noise,2,debug);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Sensor)._vptr_Sensor = (_func_int **)&PTR__Sensor_0017bc88;
  return;
}

Assistant:

LidarSensor::LidarSensor(string name, const VectorXd& noise, int debug) :
        Sensor(name, noise, 2, debug)
{}